

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void BM_Check1(int n)

{
  int iVar1;
  int iVar2;
  CheckOpString local_3a0;
  LogMessage local_398;
  string *local_338;
  _Check_string *_result_7;
  LogMessage local_328;
  string *local_2c8;
  _Check_string *_result_6;
  LogMessage local_2b8;
  string *local_258;
  _Check_string *_result_5;
  LogMessage local_248;
  string *local_1e8;
  _Check_string *_result_4;
  LogMessage local_1d8;
  string *local_178;
  _Check_string *_result_3;
  LogMessage local_168;
  string *local_108;
  _Check_string *_result_2;
  LogMessage local_f8;
  string *local_98;
  _Check_string *_result_1;
  CheckOpString local_80;
  LogMessage local_78;
  string *local_18;
  _Check_string *_result;
  int n_local;
  
  _result._4_4_ = n;
  while( true ) {
    iVar2 = _result._4_4_ + -1;
    if (_result._4_4_ < 1) {
      return;
    }
    _result._4_4_ = iVar2;
    iVar2 = google::GetReferenceableValue(iVar2);
    iVar1 = google::GetReferenceableValue(x);
    local_18 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_18 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_80,local_18);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7d,&local_80);
      google::LogMessage::stream(&local_78);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_98 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_98 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_2,local_98);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7e,(CheckOpString *)&_result_2);
      google::LogMessage::stream(&local_f8);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f8);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_108 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_108 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_3,local_108);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7f,(CheckOpString *)&_result_3);
      google::LogMessage::stream(&local_168);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_168);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_178 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_178 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_4,local_178);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x80,(CheckOpString *)&_result_4);
      google::LogMessage::stream(&local_1d8);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_1e8 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_1e8 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_5,local_1e8);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_248,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x81,(CheckOpString *)&_result_5);
      google::LogMessage::stream(&local_248);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_258 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_258 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_6,local_258);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x82,(CheckOpString *)&_result_6);
      google::LogMessage::stream(&local_2b8);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b8);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_2c8 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_2c8 != (string *)0x0) break;
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_338 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_338 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_3a0,local_338);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_398,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x84,&local_3a0);
      google::LogMessage::stream(&local_398);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_398);
    }
    local_338 = (string *)0x0;
  }
  google::CheckOpString::CheckOpString((CheckOpString *)&_result_7,local_2c8);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x83,(CheckOpString *)&_result_7);
  google::LogMessage::stream(&local_328);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_328);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}